

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

int __thiscall QListView::visualIndex(QListView *this,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QListViewPrivate *this_00;
  QModelIndex *in_RSI;
  long in_FS_OFFSET;
  QPersistentModelIndex *idx;
  add_const_t<const_QSet<QPersistentModelIndex>_> *__range1;
  int visualIndex;
  QListViewPrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QListViewItem itm;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff90;
  QModelIndex *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined1 *local_1c;
  undefined1 *local_14;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QListView *)0x87780a);
  QAbstractItemViewPrivate::executePostedLayout(in_stack_ffffffffffffff90);
  local_1c = &DAT_aaaaaaaaaaaaaaaa;
  local_14 = &DAT_aaaaaaaaaaaaaaaa;
  local_c = 0xaaaaaaaa;
  QListViewPrivate::indexToListViewItem
            ((QListViewPrivate *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  iVar2 = (*this_00->commonListView->_vptr_QCommonListViewBase[2])
                    (this_00->commonListView,&local_1c);
  QSet<QPersistentModelIndex>::begin((QSet<QPersistentModelIndex> *)this_00);
  QSet<QPersistentModelIndex>::end((QSet<QPersistentModelIndex> *)this_00);
  while( true ) {
    bVar1 = QSet<QPersistentModelIndex>::const_iterator::operator!=
                      ((const_iterator *)in_stack_ffffffffffffff90,
                       (const_iterator *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (!bVar1) break;
    in_stack_ffffffffffffff90 =
         (QAbstractItemViewPrivate *)
         QSet<QPersistentModelIndex>::const_iterator::operator*((const_iterator *)0x877905);
    in_stack_ffffffffffffff8c = QPersistentModelIndex::row();
    iVar3 = QModelIndex::row(in_RSI);
    if (in_stack_ffffffffffffff8c <= iVar3) {
      iVar2 = iVar2 + -1;
    }
    QSet<QPersistentModelIndex>::const_iterator::operator++
              ((const_iterator *)in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QListView::visualIndex(const QModelIndex &index) const
{
    Q_D(const QListView);
    d->executePostedLayout();
    QListViewItem itm = d->indexToListViewItem(index);
    int visualIndex = d->commonListView->itemIndex(itm);
    for (const auto &idx : std::as_const(d->hiddenRows)) {
        if (idx.row() <= index.row())
            --visualIndex;
    }
    return visualIndex;
}